

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Utility.cpp
# Opt level: O0

void amrex::UtilRenameDirectoryToOld(string *path,bool callbarrier)

{
  bool bVar1;
  int iVar2;
  ostream *os_;
  char *__old;
  char *__new;
  byte in_SIL;
  string newoldname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  allocator *paVar3;
  Print *in_stack_fffffffffffffda0;
  char *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  Print *in_stack_fffffffffffffdd0;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
  *in_stack_fffffffffffffdd8;
  Print *in_stack_fffffffffffffe10;
  string local_70 [32];
  string local_50 [32];
  string local_30 [39];
  byte local_9;
  
  local_9 = in_SIL & 1;
  bVar1 = ParallelContext::IOProcessorSub();
  if ((bVar1) && (bVar1 = FileExists((string *)0x11e79b6), bVar1)) {
    std::operator+(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    UniqueString_abi_cxx11_();
    std::operator+(in_stack_fffffffffffffdd8,
                   (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<pele::physics::reactions::ReactorBase,_std::default_delete<pele::physics::reactions::ReactorBase>_>_(*)()>,_true>
                    *)in_stack_fffffffffffffdd0);
    std::__cxx11::string::~string(local_70);
    std::__cxx11::string::~string(local_50);
    iVar2 = Verbose();
    if (1 < iVar2) {
      os_ = OutStream();
      Print::Print(in_stack_fffffffffffffdd0,os_);
      Print::operator<<(in_stack_fffffffffffffda0,(char (*) [37])in_stack_fffffffffffffd98);
      Print::operator<<(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      Print::operator<<(in_stack_fffffffffffffda0,(char (*) [25])in_stack_fffffffffffffd98);
      Print::operator<<(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
      Print::operator<<(in_stack_fffffffffffffda0,
                        (_func_basic_ostream<char,_std::char_traits<char>_>_ptr_basic_ostream<char,_std::char_traits<char>_>_ptr
                         *)in_stack_fffffffffffffd98);
      Print::~Print(in_stack_fffffffffffffe10);
    }
    __old = (char *)std::__cxx11::string::c_str();
    __new = (char *)std::__cxx11::string::c_str();
    rename(__old,__new);
    std::__cxx11::string::~string(local_30);
  }
  if ((local_9 & 1) != 0) {
    paVar3 = (allocator *)&stack0xfffffffffffffdd7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&stack0xfffffffffffffdd8,"amrex::UtilRenameDirectoryToOld",paVar3);
    ParallelDescriptor::Barrier((string *)&stack0xfffffffffffffdd8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdd8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffdd7);
  }
  return;
}

Assistant:

void
amrex::UtilRenameDirectoryToOld (const std::string &path, bool callbarrier)
{
  if(ParallelContext::IOProcessorSub()) {
    if(amrex::FileExists(path)) {
      std::string newoldname(path + ".old." + amrex::UniqueString());
      if (amrex::Verbose() > 1) {
          amrex::Print() << "amrex::UtilRenameDirectoryToOld():  " << path
                         << " exists.  Renaming to:  " << newoldname << std::endl;
      }
      std::rename(path.c_str(), newoldname.c_str());
    }
  }
  if(callbarrier) {
    // Force other processors to wait until directory is renamed.
    ParallelDescriptor::Barrier("amrex::UtilRenameDirectoryToOld");
  }
}